

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O2

VmConstant * EvaluateModule(InstructionVMEvalContext *ctx,VmModule *module)

{
  VmFunction *owner;
  int iVar1;
  undefined4 extraout_var;
  VmConstant *pVVar2;
  
  owner = (module->functions).tail;
  ctx->hasError = false;
  InstructionVMEvalContext::Storage::Reserve(&ctx->heap,ctx,0,0x1000);
  ctx->heapSize = ctx->heapSize + 0x1000;
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x280);
  InstructionVMEvalContext::StackFrame::StackFrame
            ((StackFrame *)CONCAT44(extraout_var,iVar1),ctx->allocator,owner);
  ctx->globalFrame = (StackFrame *)CONCAT44(extraout_var,iVar1);
  SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::push_back
            (&ctx->stackFrames,&ctx->globalFrame);
  pVVar2 = EvaluateFunction(ctx,owner);
  if (ctx->hasError == false) {
    SmallArray<InstructionVMEvalContext::StackFrame_*,_32U>::pop_back(&ctx->stackFrames);
    if ((ctx->stackFrames).count != 0) {
      __assert_fail("ctx.stackFrames.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0xa0a,"VmConstant *EvaluateModule(InstructionVMEvalContext &, VmModule *)");
    }
  }
  else {
    pVVar2 = (VmConstant *)0x0;
  }
  return pVVar2;
}

Assistant:

VmConstant* EvaluateModule(InstructionVMEvalContext &ctx, VmModule *module)
{
	VmFunction *global = module->functions.tail;

	ctx.hasError = false;

	ctx.heap.Reserve(ctx, 0, 4096);
	ctx.heapSize += 4096;

	ctx.globalFrame = new (ctx.get<InstructionVMEvalContext::StackFrame>()) InstructionVMEvalContext::StackFrame(ctx.allocator, global);
	ctx.stackFrames.push_back(ctx.globalFrame);

	VmConstant *result = EvaluateFunction(ctx, global);

	if(ctx.hasError)
		return NULL;

	ctx.stackFrames.pop_back();

	assert(ctx.stackFrames.empty());

	return result;
}